

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O1

bool __thiscall
xemmai::ast::t_block::f_forward
          (t_block *this,
          vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
          *a_privates)

{
  pointer ptVar1;
  pointer ptVar2;
  pointer ptVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  bVar6 = this->v_forward == false;
  if (bVar6) {
    this->v_forward = true;
    std::vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>::
    resize(&this->v_privates,
           (long)(a_privates->
                 super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a_privates->
                 super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2);
  }
  ptVar2 = (a_privates->
           super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(a_privates->
                super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar2;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 2;
    ptVar3 = (this->v_privates).
             super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      if ((ptVar2[lVar5].v_out == true) && (ptVar3[lVar5].v_in == false)) {
        ptVar1 = ptVar3 + lVar5;
        ptVar1->v_in = true;
        ptVar1->v_out = true;
        bVar6 = true;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  return bVar6;
}

Assistant:

bool t_block::f_forward(const std::vector<t_private>& a_privates)
{
	bool b = false;
	if (!v_forward) {
		v_forward = b = true;
		v_privates.resize(a_privates.size());
	}
	for (size_t i = 0; i < a_privates.size(); ++i) {
		if (!a_privates[i].v_out) continue;
		auto& x = v_privates[i];
		if (!x.v_in) x.v_in = x.v_out = b = true;
	}
	return b;
}